

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_emulated_ahyper_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0,GLSLstd450 op)

{
  bool forwarding;
  runtime_error *this_00;
  char **ts_9;
  char *one;
  string local_d0;
  string local_b0;
  string expr;
  string local_70;
  string local_50;
  
  one = "1.0";
  if ((this->backend).float_literal_suffix != false) {
    one = "1.0f";
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  forwarding = should_forward(this,op0);
  if (op == GLSLstd450Asinh) {
    to_enclosed_expression_abi_cxx11_(&local_d0,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_b0,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_50,this,op0,true);
    join<char_const(&)[5],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const*&,char_const(&)[3]>
              (&local_70,(spirv_cross *)"log(",(char (*) [5])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + sqrt(",
               (char (*) [9])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a5f60,
               (char (*) [4])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x399ef1,
               (char (*) [4])&one,(char **)0x3a02a0,(char (*) [3])one);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    emit_op(this,result_type,id,&expr,forwarding,false);
  }
  else {
    if (op == GLSLstd450Acosh) {
      to_enclosed_expression_abi_cxx11_(&local_d0,this,op0,true);
      to_enclosed_expression_abi_cxx11_(&local_b0,this,op0,true);
      to_enclosed_expression_abi_cxx11_(&local_50,this,op0,true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const*&,char_const(&)[3]>
                (&local_70,(spirv_cross *)"log(",(char (*) [5])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + sqrt(",
                 (char (*) [9])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a5f60,
                 (char (*) [4])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3925c1,
                 (char (*) [4])&one,(char **)0x3a02a0,(char (*) [3])one);
      ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_002ed001;
    }
    else {
      if (op != GLSLstd450Atanh) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this_00,"Invalid op.");
        *(undefined ***)this_00 = &PTR__runtime_error_0049deb0;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      to_enclosed_expression_abi_cxx11_(&local_d0,this,op0,true);
      ts_9 = (char **)0x2ecd55;
      to_enclosed_expression_abi_cxx11_(&local_b0,this,op0,true);
      local_50._M_dataplus._M_p = "";
      if ((this->backend).float_literal_suffix != false) {
        local_50._M_dataplus._M_p = "f";
      }
      join<char_const(&)[6],char_const*&,char_const(&)[4],std::__cxx11::string,char_const(&)[6],char_const*&,char_const(&)[4],std::__cxx11::string,char_const(&)[9],char_const*>
                (&local_70,(spirv_cross *)"log((",(char (*) [6])&one,(char **)0x399ef1,
                 (char (*) [4])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") / (",
                 (char (*) [6])&one,(char **)0x3925c1,(char (*) [4])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")) * 0.5",
                 (char (*) [9])&local_50,ts_9);
      ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_002ed001;
    }
    operator_delete(local_d0._M_dataplus._M_p);
  }
LAB_002ed001:
  emit_op(this,result_type,id,&expr,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,id,op0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_emulated_ahyper_op(uint32_t result_type, uint32_t id, uint32_t op0, GLSLstd450 op)
{
	const char *one = backend.float_literal_suffix ? "1.0f" : "1.0";
	std::string expr;
	bool forward = should_forward(op0);

	switch (op)
	{
	case GLSLstd450Asinh:
		expr = join("log(", to_enclosed_expression(op0), " + sqrt(",
		            to_enclosed_expression(op0), " * ", to_enclosed_expression(op0), " + ", one, "))");
		emit_op(result_type, id, expr, forward);
		break;

	case GLSLstd450Acosh:
		expr = join("log(", to_enclosed_expression(op0), " + sqrt(",
		            to_enclosed_expression(op0), " * ", to_enclosed_expression(op0), " - ", one, "))");
		break;

	case GLSLstd450Atanh:
		expr = join("log((", one, " + ", to_enclosed_expression(op0), ") / "
		            "(", one, " - ", to_enclosed_expression(op0), ")) * 0.5",
		            backend.float_literal_suffix ? "f" : "");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid op.");
	}

	emit_op(result_type, id, expr, forward);
	inherit_expression_dependencies(id, op0);
}